

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

wstring * __thiscall
mjs::index_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,uint32_t index)

{
  uint uVar1;
  wchar_t *__s;
  allocator<wchar_t> local_39;
  wchar_t buffer [12];
  ulong uVar2;
  
  if ((int)this != -1) {
    __s = buffer + 0xb;
    buffer[0xb] = L'\0';
    uVar2 = (ulong)this & 0xffffffff;
    do {
      uVar1 = (uint)uVar2;
      __s[-1] = (uint)(uVar2 % 10) | 0x30;
      __s = __s + -1;
      uVar2 = uVar2 / 10;
    } while (9 < uVar1);
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,__s,&local_39);
    return __return_storage_ptr__;
  }
  __assert_fail("index != UINT32_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                ,0x30b,"std::wstring mjs::index_string(uint32_t)");
}

Assistant:

std::wstring index_string(uint32_t index) {
    assert(index != UINT32_MAX);
    wchar_t buffer[12], *p = &buffer[sizeof(buffer)/sizeof(*buffer)];
    *--p = '\0';
    do {
        *--p = '0' + index % 10;
        index /= 10;
    } while (index);
    return std::wstring{p};
}